

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_mod_m68k(floatx80 a,floatx80 b,float_status *status)

{
  flag fVar1;
  uint64_t uVar2;
  uint16_t uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  floatx80 fVar5;
  floatx80 fVar6;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 b_00;
  floatx80 b_01;
  ulong local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t term1;
  uint64_t term0;
  uint64_t qTemp;
  uint64_t bSig;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t expDiff;
  int32_t bExp;
  int32_t aExp;
  flag zSign;
  flag aSign;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  
  status_local = (float_status *)b.low;
  b_local._8_8_ = a.low;
  b_local.low._0_2_ = b.high;
  uVar3 = a.high;
  a_00._10_6_ = 0;
  a_00.low = (long)a._0_10_;
  a_00.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  aSig1 = extractFloatx80Frac(a_00);
  a_01.high = uVar3;
  a_01.low = b_local._8_8_;
  a_01._10_6_ = 0;
  expDiff = extractFloatx80Exp(a_01);
  a_02.high = uVar3;
  a_02.low = b_local._8_8_;
  a_02._10_6_ = 0;
  bExp._3_1_ = extractFloatx80Sign(a_02);
  a_03.high = (uint16_t)b_local.low;
  a_03.low = (uint64_t)status_local;
  a_03._10_6_ = 0;
  qTemp = extractFloatx80Frac(a_03);
  a_04.high = (uint16_t)b_local.low;
  a_04.low = (uint64_t)status_local;
  a_04._10_6_ = 0;
  aSig0._4_4_ = extractFloatx80Exp(a_04);
  if (expDiff == 0x7fff) {
    if (((aSig1 & 0x7fffffffffffffff) != 0) ||
       ((aSig0._4_4_ == 0x7fff && ((qTemp & 0x7fffffffffffffff) != 0)))) {
      a_05.high = uVar3;
      a_05.low = b_local._8_8_;
      b_00.high = (uint16_t)b_local.low;
      b_00.low = (uint64_t)status_local;
      a_05._10_6_ = 0;
      b_00._10_6_ = 0;
      fVar5 = propagateFloatx80NaN_m68k(a_05,b_00,_aExp);
      uVar3 = fVar5.high;
      goto LAB_008affc9;
    }
LAB_008afd01:
    float_raise_m68k('\x01',_aExp);
    fVar5 = floatx80_default_nan_m68k(_aExp);
    uVar3 = fVar5.high;
  }
  else {
    if (aSig0._4_4_ == 0x7fff) {
      if ((qTemp & 0x7fffffffffffffff) == 0) {
        fVar5._8_8_ = extraout_RDX;
        fVar5.low = b_local._8_8_;
      }
      else {
        a_06.high = uVar3;
        a_06.low = b_local._8_8_;
        b_01.high = (uint16_t)b_local.low;
        b_01.low = (uint64_t)status_local;
        a_06._10_6_ = 0;
        b_01._10_6_ = 0;
        fVar5 = propagateFloatx80NaN_m68k(a_06,b_01,_aExp);
        uVar3 = fVar5.high;
      }
      goto LAB_008affc9;
    }
    uVar4 = extraout_RDX;
    if (aSig0._4_4_ == 0) {
      if (qTemp == 0) goto LAB_008afd01;
      normalizeFloatx80Subnormal_m68k(qTemp,(int32_t *)((long)&aSig0 + 4),&qTemp);
      uVar4 = extraout_RDX_00;
    }
    if (expDiff == 0) {
      if ((aSig1 & 0x7fffffffffffffff) == 0) {
        fVar5._8_8_ = uVar4;
        fVar5.low = b_local._8_8_;
        goto LAB_008affc9;
      }
      normalizeFloatx80Subnormal_m68k(aSig1,&expDiff,&aSig1);
      uVar4 = extraout_RDX_01;
    }
    qTemp = qTemp | 0x8000000000000000;
    bExp._2_1_ = bExp._3_1_;
    bSig = 0;
    if (expDiff - aSig0._4_4_ < 0) {
      fVar5._8_8_ = uVar4;
      fVar5.low = b_local._8_8_;
    }
    else {
      term0 = (uint64_t)(int)(uint)(qTemp <= aSig1);
      if (term0 != 0) {
        aSig1 = aSig1 - qTemp;
      }
      for (aSig0._0_4_ = (expDiff - aSig0._4_4_) + -0x40; 0 < (int)aSig0;
          aSig0._0_4_ = (int)aSig0 + -0x3e) {
        local_88 = estimateDiv128To64(aSig1,bSig,qTemp);
        if (local_88 < 3) {
          local_88 = 0;
        }
        else {
          local_88 = local_88 - 2;
        }
        term0 = local_88;
        mul64To128(qTemp,local_88,&term1,&local_80);
        sub128(aSig1,bSig,term1,local_80,&aSig1,&bSig);
        shortShift128Left(aSig1,bSig,0x3e,&aSig1,&bSig);
      }
      aSig0._0_4_ = (int)aSig0 + 0x40;
      if (0 < (int)aSig0) {
        uVar2 = estimateDiv128To64(aSig1,bSig,qTemp);
        if (uVar2 < 3) {
          local_90 = 0;
        }
        else {
          local_90 = uVar2 - 2;
        }
        term0 = local_90 >> (0x40U - (char)(int)aSig0 & 0x3f);
        mul64To128(qTemp,term0 << (0x40U - (char)(int)aSig0 & 0x3f),&term1,&local_80);
        sub128(aSig1,bSig,term1,local_80,&aSig1,&bSig);
        shortShift128Left(0,qTemp,0x40 - (int)aSig0,&term1,&local_80);
        while (fVar1 = le128(term1,local_80,aSig1,bSig), fVar1 != '\0') {
          term0 = term0 + 1;
          sub128(aSig1,bSig,term1,local_80,&aSig1,&bSig);
        }
      }
      fVar5 = normalizeRoundAndPackFloatx80_m68k
                        ('P',bExp._2_1_,aSig0._4_4_ + (int)aSig0,aSig1,bSig,_aExp);
      uVar3 = fVar5.high;
    }
  }
LAB_008affc9:
  a_local._8_8_ = fVar5.low;
  fVar6._10_6_ = fVar5._10_6_;
  fVar6.high = uVar3;
  fVar6.low = a_local._8_8_;
  return fVar6;
}

Assistant:

floatx80 floatx80_mod(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t qTemp, term0, term1;

    aSig0 = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);
    bSig = extractFloatx80Frac(b);
    bExp = extractFloatx80Exp(b);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig0 << 1)
            || ((bExp == 0x7FFF) && (uint64_t) (bSig << 1))) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if (bExp == 0x7FFF) {
        if ((uint64_t) (bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if (bExp == 0) {
        if (bSig == 0) {
        invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal(bSig, &bExp, &bSig);
    }
    if (aExp == 0) {
        if ((uint64_t) (aSig0 << 1) == 0) {
            return a;
        }
        normalizeFloatx80Subnormal(aSig0, &aExp, &aSig0);
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if (expDiff < 0) {
        return a;
    }
    qTemp = (bSig <= aSig0);
    if (qTemp) {
        aSig0 -= bSig;
    }
    expDiff -= 64;
    while (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        mul64To128(bSig, qTemp, &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(aSig0, aSig1, 62, &aSig0, &aSig1);
        expDiff -= 62;
    }
    expDiff += 64;
    if (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        qTemp >>= 64 - expDiff;
        mul64To128(bSig, qTemp << (64 - expDiff), &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(0, bSig, 64 - expDiff, &term0, &term1);
        while (le128(term0, term1, aSig0, aSig1)) {
            ++qTemp;
            sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        }
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);
}